

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cc
# Opt level: O3

void __thiscall Glucose::SimpSolver::gatherTouchedClauses(SimpSolver *this)

{
  uint uVar1;
  uint *puVar2;
  ulong uVar3;
  int iVar4;
  int iVar5;
  int iVar7;
  long lVar8;
  int iVar9;
  int iVar10;
  vec<unsigned_int> *pvVar11;
  int i;
  int local_34;
  int iVar6;
  
  if (this->n_touched != 0) {
    iVar4 = (this->subsumption_queue).end;
    iVar7 = (this->subsumption_queue).buf.sz;
    iVar9 = (this->subsumption_queue).first;
    iVar10 = 0;
    iVar6 = 0;
    if (iVar4 < iVar9) {
      iVar6 = iVar7;
    }
    iVar5 = iVar6 + (iVar4 - iVar9);
    if (iVar5 != 0 && SCARRY4(iVar6,iVar4 - iVar9) == iVar5 < 0) {
      do {
        uVar1 = (this->subsumption_queue).buf.data[(iVar9 + iVar10) % iVar7];
        puVar2 = (this->super_Solver).ca.super_RegionAllocator<unsigned_int>.memory;
        uVar3 = *(ulong *)(puVar2 + uVar1);
        if ((uVar3 & 3) == 0) {
          *(ulong *)(puVar2 + uVar1) = uVar3 | 2;
          iVar4 = (this->subsumption_queue).end;
          iVar7 = (this->subsumption_queue).buf.sz;
          iVar9 = (this->subsumption_queue).first;
        }
        iVar10 = iVar10 + 1;
        iVar6 = 0;
        if (iVar4 < iVar9) {
          iVar6 = iVar7;
        }
      } while (iVar10 < (iVar4 - iVar9) + iVar6);
    }
    local_34 = 0;
    iVar6 = (this->touched).sz;
    if (0 < iVar6) {
      do {
        lVar8 = (long)local_34;
        if ((this->touched).data[lVar8] != '\0') {
          if ((this->occurs).dirty.data[lVar8] != '\0') {
            OccLists<int,_Glucose::vec<unsigned_int>,_Glucose::SimpSolver::ClauseDeleted>::clean
                      (&this->occurs,&local_34);
            lVar8 = (long)local_34;
          }
          pvVar11 = (this->occurs).occs.data;
          iVar4 = pvVar11[lVar8].sz;
          if (0 < iVar4) {
            pvVar11 = pvVar11 + lVar8;
            lVar8 = 0;
            do {
              if (((this->super_Solver).ca.super_RegionAllocator<unsigned_int>.memory
                   [pvVar11->data[lVar8]] & 3) == 0) {
                Queue<unsigned_int>::insert(&this->subsumption_queue,pvVar11->data[lVar8]);
                puVar2 = (this->super_Solver).ca.super_RegionAllocator<unsigned_int>.memory;
                *(ulong *)(puVar2 + pvVar11->data[lVar8]) =
                     *(ulong *)(puVar2 + pvVar11->data[lVar8]) & 0xfffffffffffffffc | 2;
                iVar4 = pvVar11->sz;
              }
              lVar8 = lVar8 + 1;
            } while (lVar8 < iVar4);
          }
          (this->touched).data[local_34] = '\0';
          iVar6 = (this->touched).sz;
        }
        local_34 = local_34 + 1;
      } while (local_34 < iVar6);
      iVar4 = (this->subsumption_queue).end;
      iVar7 = (this->subsumption_queue).buf.sz;
      iVar9 = (this->subsumption_queue).first;
    }
    iVar10 = 0;
    iVar6 = 0;
    if (iVar4 < iVar9) {
      iVar6 = iVar7;
    }
    iVar5 = iVar6 + (iVar4 - iVar9);
    if (iVar5 != 0 && SCARRY4(iVar6,iVar4 - iVar9) == iVar5 < 0) {
      do {
        uVar1 = (this->subsumption_queue).buf.data[(iVar9 + iVar10) % iVar7];
        puVar2 = (this->super_Solver).ca.super_RegionAllocator<unsigned_int>.memory;
        uVar3 = *(ulong *)(puVar2 + uVar1);
        if (((uint)uVar3 & 3) == 2) {
          *(ulong *)(puVar2 + uVar1) = uVar3 & 0xfffffffffffffffc;
          iVar4 = (this->subsumption_queue).end;
          iVar7 = (this->subsumption_queue).buf.sz;
          iVar9 = (this->subsumption_queue).first;
        }
        iVar10 = iVar10 + 1;
        iVar6 = 0;
        if (iVar4 < iVar9) {
          iVar6 = iVar7;
        }
      } while (iVar10 < (iVar4 - iVar9) + iVar6);
    }
    this->n_touched = 0;
  }
  return;
}

Assistant:

void SimpSolver::gatherTouchedClauses()
{
    if (n_touched == 0) return;

    int i,j;
    for (i = j = 0; i < subsumption_queue.size(); i++)
        if (ca[subsumption_queue[i]].mark() == 0)
            ca[subsumption_queue[i]].mark(2);

    for (i = 0; i < touched.size(); i++)
        if (touched[i]){
            const vec<CRef>& cs = occurs.lookup(i);
            for (j = 0; j < cs.size(); j++)
                if (ca[cs[j]].mark() == 0){
                    subsumption_queue.insert(cs[j]);
                    ca[cs[j]].mark(2);
                }
            touched[i] = 0;
        }

    for (i = 0; i < subsumption_queue.size(); i++)
        if (ca[subsumption_queue[i]].mark() == 2)
            ca[subsumption_queue[i]].mark(0);

    n_touched = 0;
}